

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void kwsysProcessCleanup(cmsysProcess *cp,int error)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  char *__src;
  bool bVar4;
  int local_1c;
  int local_18;
  int status;
  int i;
  int error_local;
  cmsysProcess *cp_local;
  
  status = error;
  _i = cp;
  if (error != 0) {
    if (cp->ErrorMessage[0] == '\0') {
      piVar3 = __errno_location();
      __src = strerror(*piVar3);
      strncpy(cp->ErrorMessage,__src,0x400);
    }
    _i->State = 1;
    if (_i->ForkPIDs != (pid_t *)0x0) {
      for (local_18 = 0; local_18 < _i->NumberOfCommands; local_18 = local_18 + 1) {
        if (_i->ForkPIDs[local_18] != 0) {
          kwsysProcessKill(_i->ForkPIDs[local_18]);
          do {
            _Var1 = waitpid(_i->ForkPIDs[local_18],&local_1c,0);
            bVar4 = false;
            if (_Var1 < 0) {
              piVar3 = __errno_location();
              bVar4 = *piVar3 == 4;
            }
          } while (bVar4);
        }
      }
    }
    if (_i->RealWorkingDirectory != (char *)0x0) {
      do {
        iVar2 = chdir(_i->RealWorkingDirectory);
        bVar4 = false;
        if (iVar2 < 0) {
          piVar3 = __errno_location();
          bVar4 = *piVar3 == 4;
        }
      } while (bVar4);
    }
  }
  if (_i->OptionDetach == 0) {
    kwsysProcessesRemove(_i);
  }
  if (_i->ForkPIDs != (pid_t *)0x0) {
    free(_i->ForkPIDs);
    _i->ForkPIDs = (pid_t *)0x0;
  }
  if (_i->RealWorkingDirectory != (char *)0x0) {
    free(_i->RealWorkingDirectory);
    _i->RealWorkingDirectory = (char *)0x0;
  }
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    kwsysProcessCleanupDescriptor(_i->PipeReadEnds + local_18);
  }
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    kwsysProcessCleanupDescriptor(_i->PipeChildStd + local_18);
  }
  return;
}

Assistant:

static void kwsysProcessCleanup(kwsysProcess* cp, int error)
{
  int i;

  if(error)
    {
    /* We are cleaning up due to an error.  Report the error message
       if one has not been provided already.  */
    if(cp->ErrorMessage[0] == 0)
      {
      strncpy(cp->ErrorMessage, strerror(errno), KWSYSPE_PIPE_BUFFER_SIZE);
      }

    /* Set the error state.  */
    cp->State = kwsysProcess_State_Error;

    /* Kill any children already started.  */
    if(cp->ForkPIDs)
      {
      int status;
      for(i=0; i < cp->NumberOfCommands; ++i)
        {
        if(cp->ForkPIDs[i])
          {
          /* Kill the child.  */
          kwsysProcessKill(cp->ForkPIDs[i]);

          /* Reap the child.  Keep trying until the call is not
             interrupted.  */
          while((waitpid(cp->ForkPIDs[i], &status, 0) < 0) &&
                (errno == EINTR));
          }
        }
      }

    /* Restore the working directory.  */
    if(cp->RealWorkingDirectory)
      {
      while((chdir(cp->RealWorkingDirectory) < 0) && (errno == EINTR));
      }
    }

  /* If not creating a detached child, remove this object from the
     global set of process objects that wish to be notified when a
     child exits.  */
  if(!cp->OptionDetach)
    {
    kwsysProcessesRemove(cp);
    }

  /* Free memory.  */
  if(cp->ForkPIDs)
    {
    free(cp->ForkPIDs);
    cp->ForkPIDs = 0;
    }
  if(cp->RealWorkingDirectory)
    {
    free(cp->RealWorkingDirectory);
    cp->RealWorkingDirectory = 0;
    }

  /* Close pipe handles.  */
  for(i=0; i < KWSYSPE_PIPE_COUNT; ++i)
    {
    kwsysProcessCleanupDescriptor(&cp->PipeReadEnds[i]);
    }
  for(i=0; i < 3; ++i)
    {
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[i]);
    }
}